

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_make_synclo_op(sexp ctx,sexp self,sexp_sint_t n,sexp env,sexp fv,sexp expr)

{
  sexp in_RCX;
  sexp in_RDX;
  sexp in_R8;
  sexp in_R9;
  sexp res;
  sexp_uint_t in_stack_ffffffffffffffc0;
  sexp local_8;
  
  if ((((ulong)in_RCX & 3) == 0) && (in_RCX->tag == 0x17)) {
    if ((((((ulong)in_R9 & 0xf) == 6) || ((((ulong)in_R9 & 3) == 0 && (in_R9->tag == 7)))) ||
        ((((ulong)in_R9 & 3) == 0 && (in_R9->tag == 6)))) ||
       ((local_8 = in_R9, ((ulong)in_R9 & 3) == 0 && (in_R9->tag == 0x16)))) {
      local_8 = sexp_alloc_tagged_aux(in_R8,(size_t)in_R9,in_stack_ffffffffffffffc0);
      (local_8->value).type.name = in_RCX;
      (local_8->value).type.cpl = in_R8;
      (local_8->value).type.slots = in_R9;
      (local_8->value).bytecode.length = 0x3e;
    }
  }
  else {
    local_8 = sexp_type_exception(in_RDX,in_RCX,(sexp_uint_t)in_R8,in_R9);
  }
  return local_8;
}

Assistant:

sexp sexp_make_synclo_op (sexp ctx, sexp self, sexp_sint_t n, sexp env, sexp fv, sexp expr) {
  sexp res;
  sexp_assert_type(ctx, sexp_envp, SEXP_ENV, env);
  if (! (sexp_symbolp(expr) || sexp_pairp(expr) || sexp_synclop(expr)))
    return expr;
  res = sexp_alloc_type(ctx, synclo, SEXP_SYNCLO);
  if (SEXP_USE_FLAT_SYNTACTIC_CLOSURES && sexp_synclop(expr)) {
    sexp_synclo_env(res) = sexp_synclo_env(expr);
    sexp_synclo_free_vars(res) = sexp_synclo_free_vars(expr);
    sexp_synclo_expr(res) = sexp_synclo_expr(expr);
    sexp_synclo_rename(res) = sexp_synclo_rename(expr);
  } else {
    sexp_synclo_env(res) = env;
    sexp_synclo_free_vars(res) = fv;
    sexp_synclo_expr(res) = expr;
    sexp_synclo_rename(res) = SEXP_FALSE;
  }
  return res;
}